

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void testTinySVD_4x4<float>(Matrix44<float> *A)

{
  float fVar1;
  bool bVar2;
  ostream *this;
  float *pfVar3;
  ostream *poVar4;
  ostream *poVar5;
  ostream *poVar6;
  ostream *poVar7;
  Matrix44<float> *in_RDI;
  Matrix44<float> *in_stack_00000030;
  int j;
  int i;
  Matrix44<float> B;
  int cols [4];
  int local_a0;
  int local_9c;
  Matrix44<float> local_98;
  int local_58 [20];
  Matrix44<float> *local_8;
  
  local_8 = in_RDI;
  this = std::operator<<((ostream *)&std::cout,"Verifying SVD for [[");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,0);
  poVar4 = (ostream *)std::ostream::operator<<(this,*pfVar3);
  poVar4 = std::operator<<(poVar4,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar4,pfVar3[1]);
  poVar5 = std::operator<<(poVar5,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar5,pfVar3[2]);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[3]);
  poVar6 = std::operator<<(poVar6,"], ");
  poVar6 = std::operator<<(poVar6,"[");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pfVar3);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[1]);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[2]);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[3]);
  poVar7 = std::operator<<(poVar7,"], ");
  poVar7 = std::operator<<(poVar7,"[");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pfVar3);
  poVar7 = std::operator<<(poVar7,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pfVar3[1]);
  poVar7 = std::operator<<(poVar7,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pfVar3[2]);
  poVar7 = std::operator<<(poVar7,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,2);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pfVar3[3]);
  poVar7 = std::operator<<(poVar7,"], ");
  poVar7 = std::operator<<(poVar7,"[");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,3);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pfVar3);
  poVar7 = std::operator<<(poVar7,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,3);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pfVar3[1]);
  poVar7 = std::operator<<(poVar7,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,3);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pfVar3[2]);
  poVar7 = std::operator<<(poVar7,", ");
  pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,3);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pfVar3[3]);
  std::operator<<(poVar7,"]]\n");
  verifyTinySVD_4x4<float>(in_stack_00000030);
  Imath_2_5::Matrix44<float>::transposed((Matrix44<float> *)poVar6);
  verifyTinySVD_4x4<float>(in_stack_00000030);
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 2;
  local_58[3] = 3;
  do {
    Imath_2_5::Matrix44<float>::Matrix44((Matrix44<float> *)this);
    for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
      for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
        pfVar3 = Imath_2_5::Matrix44<float>::operator[](local_8,local_9c);
        fVar1 = pfVar3[local_58[local_a0]];
        pfVar3 = Imath_2_5::Matrix44<float>::operator[](&local_98,local_9c);
        pfVar3[local_a0] = fVar1;
      }
    }
    verifyTinySVD_4x4<float>(in_stack_00000030);
    bVar2 = std::next_permutation<int*>((int *)poVar5,(int *)poVar4);
  } while (bVar2);
  return;
}

Assistant:

void
testTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", " << A[0][2] << ", " << A[0][3] << "], "
                                 << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << ", " << A[1][3] << "], "
                                 << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << ", " << A[2][3] << "], "
                                 << "[" << A[3][0] << ", " << A[3][1] << ", " << A[3][2] << ", " << A[3][3] << "]]\n";
 
    verifyTinySVD_4x4 (A);
    verifyTinySVD_4x4 (A.transposed());

    // Try all different orderings of the columns of A:
    int cols[4] = { 0, 1, 2, 3 };
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix44<T> B;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_4x4 (B);
    } while (std::next_permutation (cols, cols + 4));
}